

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O0

int npas4::impl::ParseLine(char *line)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t i;
  char *line_local;
  
  sVar3 = strlen(line);
  i = (size_t)line;
  while( true ) {
    bVar1 = true;
    if ('/' < *(char *)i) {
      bVar1 = '9' < *(char *)i;
    }
    if (!bVar1) break;
    i = i + 1;
  }
  *(undefined1 *)(i + (sVar3 - 3)) = 0;
  iVar2 = atoi((char *)i);
  return iVar2;
}

Assistant:

int ParseLine(char* line)
		{
			const auto i = strlen(line);

			while(*line < '0' || *line > '9')
			{
				line++;
			}

			line[i - 3] = '\0';
			return atoi(line);
		}